

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestState.h
# Opt level: O0

void __thiscall TestState::TestState(TestState *this,shared_ptr<GameData> *data)

{
  shared_ptr<GameData> local_28;
  shared_ptr<GameData> *local_18;
  shared_ptr<GameData> *data_local;
  TestState *this_local;
  
  local_18 = data;
  data_local = (shared_ptr<GameData> *)this;
  std::shared_ptr<GameData>::shared_ptr(&local_28,data);
  GameState::GameState(&this->super_GameState,&local_28);
  std::shared_ptr<GameData>::~shared_ptr(&local_28);
  (this->super_GameState)._vptr_GameState = (_func_int **)&PTR_processInput_00278740;
  return;
}

Assistant:

TestState(std::shared_ptr<GameData> data) : GameState(data) { }